

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qxdgnotificationproxy_p.cpp
# Opt level: O1

void QXdgNotificationInterface::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QDBusError *this;
  QDBusPendingCall *pQVar1;
  long *plVar2;
  offset_in_QXdgNotificationInterface_to_subr *candidate;
  undefined4 uVar3;
  QMetaType *pQVar4;
  int iVar5;
  QDBusPendingReplyBase *this_00;
  long in_FS_OFFSET;
  QDBusPendingReply<QString,_QString,_QString,_QString> _r;
  QDBusPendingReply<> _r_1;
  QDBusReply<QString> _r_3;
  QDBusPendingReply<unsigned_int> _r_4;
  QDBusPendingReplyBase local_a8;
  undefined1 local_a0 [8];
  QDBusReply<QString> local_98;
  QArrayData local_40;
  undefined8 local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == IndexOfMethod) {
    plVar2 = (long *)_a[1];
    if ((((code *)*plVar2 == ActionInvoked) && (uVar3 = 0, plVar2[1] == 0)) ||
       (((code *)*plVar2 == NotificationClosed && (uVar3 = 1, plVar2[1] == 0)))) {
      *(undefined4 *)*_a = uVar3;
    }
    goto LAB_0065ec36;
  }
  if (_c != InvokeMetaMethod) goto LAB_0065ec36;
  switch(_id) {
  case 0:
    local_98.m_error.msg.d.ptr = (char16_t *)_a[2];
    local_40.ref_._q_value.super___atomic_base<int>._M_i = *_a[1];
    iVar5 = 0;
    goto LAB_0065ea81;
  case 1:
    local_40.ref_._q_value.super___atomic_base<int>._M_i = *_a[1];
    local_98.m_error.msg.d.ptr = (char16_t *)local_a0;
    local_a0._0_4_ = *_a[2];
    iVar5 = 1;
LAB_0065ea81:
    local_98.m_error.msg.d.d = (Data *)&local_40;
    local_98.m_error._0_8_ = (QArrayData *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar5,(void **)(local_a0 + 8));
    goto LAB_0065ec36;
  case 2:
    local_a0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    local_a8._0_4_ = *_a[1];
    local_98.m_error._0_8_ = (QArrayData *)0x0;
    local_98.m_error.msg.d.d = (Data *)0x6dd85e;
    local_98.m_error.msg.d.ptr = (char16_t *)0x11;
    QDBusAbstractInterface::asyncCall<unsigned_int&>
              ((QDBusAbstractInterface *)&local_40,(QString *)_o,(uint *)(local_a0 + 8));
    QDBusPendingReplyBase::QDBusPendingReplyBase((QDBusPendingReplyBase *)local_a0);
    QDBusPendingReplyBase::assign((QDBusPendingCall *)local_a0);
    if ((QDBusPendingReplyBase)local_a0 != (QDBusPendingReplyBase)0x0) {
      QDBusPendingReplyBase::setMetaTypes((int)local_a0,(QMetaType *)0x0);
    }
    QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)&local_40);
    if ((QArrayData *)local_98.m_error._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98.m_error._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98.m_error._0_8_)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98.m_error._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_98.m_error._0_8_,2,0x10);
      }
    }
    pQVar1 = (QDBusPendingCall *)*_a;
    if ((pQVar1 != (QDBusPendingCall *)0x0) &&
       (QDBusPendingReplyBase::assign(pQVar1), *(long *)pQVar1 != 0)) {
      QDBusPendingReplyBase::setMetaTypes((int)pQVar1,(QMetaType *)0x0);
    }
    this_00 = (QDBusPendingReplyBase *)local_a0;
    break;
  case 3:
    local_a8 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    local_98.m_error._0_8_ = (QArrayData *)0x0;
    local_98.m_error.msg.d.d = (Data *)0x6dd882;
    local_98.m_error.msg.d.ptr = (char16_t *)0xf;
    QDBusAbstractInterface::doAsyncCall((QString *)local_a0,(QVariant *)_o,(ulong)(local_a0 + 8));
    QDBusPendingReplyBase::QDBusPendingReplyBase
              ((QDBusPendingReplyBase *)&local_a8.super_QDBusPendingCall);
    QDBusPendingReplyBase::assign(&local_a8.super_QDBusPendingCall);
    if (local_a8 != (QDBusPendingReplyBase)0x0) {
      local_40._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QString>>::metaType;
      QDBusPendingReplyBase::setMetaTypes((int)&local_a8,(QMetaType *)0x1);
    }
    QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)local_a0);
    if ((QArrayData *)local_98.m_error._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98.m_error._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98.m_error._0_8_)->_q_value).super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98.m_error._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate((QArrayData *)local_98.m_error._0_8_,2,0x10);
      }
    }
    pQVar1 = (QDBusPendingCall *)*_a;
    if ((pQVar1 != (QDBusPendingCall *)0x0) &&
       (QDBusPendingReplyBase::assign(pQVar1), *(long *)pQVar1 != 0)) {
      local_98.m_error._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QList<QString>>::metaType;
      iVar5 = (int)pQVar1;
      pQVar4 = (QMetaType *)0x1;
LAB_0065ea28:
      QDBusPendingReplyBase::setMetaTypes(iVar5,pQVar4);
    }
    goto LAB_0065ea2d;
  case 4:
    local_a8 = (QDBusPendingReplyBase)&DAT_aaaaaaaaaaaaaaaa;
    local_40._0_8_ = (QDBusPendingReplyBase)0x0;
    local_40.alloc = 0x6dd8a2;
    local_30 = 0x14;
    QDBusAbstractInterface::doAsyncCall((QString *)local_a0,(QVariant *)_o,(ulong)&local_40);
    QDBusPendingReplyBase::QDBusPendingReplyBase
              ((QDBusPendingReplyBase *)&local_a8.super_QDBusPendingCall);
    QDBusPendingReplyBase::assign(&local_a8.super_QDBusPendingCall);
    if (local_a8 != (QDBusPendingReplyBase)0x0) {
      local_98.m_error._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      local_98.m_error.msg.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      local_98.m_error.msg.d.ptr =
           (char16_t *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      local_98.m_error.msg.d.size =
           (qsizetype)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      QDBusPendingReplyBase::setMetaTypes((int)&local_a8,(QMetaType *)0x4);
    }
    QDBusPendingCall::~QDBusPendingCall((QDBusPendingCall *)local_a0);
    if ((QDBusPendingReplyBase)local_40._0_8_ != (QDBusPendingReplyBase)0x0) {
      LOCK();
      *(int *)local_40._0_8_ = (int)*(Type *)local_40._0_8_ + -1;
      UNLOCK();
      if ((__atomic_base<int>)*(__int_type *)local_40._0_8_ == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_40._0_8_,2,0x10);
      }
    }
    pQVar1 = (QDBusPendingCall *)*_a;
    if ((pQVar1 != (QDBusPendingCall *)0x0) &&
       (QDBusPendingReplyBase::assign(pQVar1), *(long *)pQVar1 != 0)) {
      local_98.m_error._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      local_98.m_error.msg.d.d = (Data *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      local_98.m_error.msg.d.ptr =
           (char16_t *)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      local_98.m_error.msg.d.size =
           (qsizetype)&QtPrivate::QMetaTypeInterfaceWrapper<QString>::metaType;
      iVar5 = (int)pQVar1;
      pQVar4 = (QMetaType *)0x4;
      goto LAB_0065ea28;
    }
LAB_0065ea2d:
    this_00 = &local_a8;
    break;
  case 5:
    local_98.m_data.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.m_data.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.m_data.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.m_error.nm.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.m_error.unused = &DAT_aaaaaaaaaaaaaaaa;
    local_98.m_error.nm.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.m_error.nm.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.m_error.msg.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.m_error.msg.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_98.m_error._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_98.m_error.msg.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    getServerInformation
              ((QDBusReply<QString> *)(local_a0 + 8),(QXdgNotificationInterface *)_o,
               (QString *)_a[1],(QString *)_a[2],(QString *)_a[3]);
    this = (QDBusError *)*_a;
    if (this != (QDBusError *)0x0) {
      QDBusError::operator=(this,(QDBusError *)(local_a0 + 8));
      QString::operator=((QString *)(this + 1),&local_98.m_data);
    }
    if (&(local_98.m_data.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_98.m_data.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
         ) {
        QArrayData::deallocate(&(local_98.m_data.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.m_error.nm.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_error.nm.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_error.nm.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           + -1;
      UNLOCK();
      if (((local_98.m_error.nm.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_98.m_error.nm.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (&(local_98.m_error.msg.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.m_error.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.m_error.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
           _M_i + -1;
      UNLOCK();
      if (((local_98.m_error.msg.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
          == 0) {
        QArrayData::deallocate(&(local_98.m_error.msg.d.d)->super_QArrayData,2,0x10);
      }
    }
    goto LAB_0065ec36;
  case 6:
    local_40._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    notify((QDBusPendingReply<unsigned_int> *)&local_40,(QXdgNotificationInterface *)_o,
           (QString *)_a[1],*_a[2],(QString *)_a[3],(QString *)_a[4],(QString *)_a[5],
           (QStringList *)_a[6],(QVariantMap *)_a[7],*_a[8]);
    pQVar1 = (QDBusPendingCall *)*_a;
    if ((pQVar1 != (QDBusPendingCall *)0x0) &&
       (QDBusPendingReplyBase::assign(pQVar1), *(long *)pQVar1 != 0)) {
      local_98.m_error._0_8_ = &QtPrivate::QMetaTypeInterfaceWrapper<unsigned_int>::metaType;
      QDBusPendingReplyBase::setMetaTypes((int)pQVar1,(QMetaType *)0x1);
    }
    this_00 = (QDBusPendingReplyBase *)&local_40;
    break;
  default:
    goto LAB_0065ec36;
  }
  QDBusPendingReplyBase::~QDBusPendingReplyBase(this_00);
LAB_0065ec36:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXdgNotificationInterface::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QXdgNotificationInterface *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->ActionInvoked((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[2]))); break;
        case 1: _t->NotificationClosed((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2]))); break;
        case 2: { QDBusPendingReply<> _r = _t->closeNotification((*reinterpret_cast< std::add_pointer_t<uint>>(_a[1])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<>*>(_a[0]) = std::move(_r); }  break;
        case 3: { QDBusPendingReply<QStringList> _r = _t->getCapabilities();
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QStringList>*>(_a[0]) = std::move(_r); }  break;
        case 4: { QDBusPendingReply<QString,QString,QString,QString> _r = _t->getServerInformation();
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<QString,QString,QString,QString>*>(_a[0]) = std::move(_r); }  break;
        case 5: { QDBusReply<QString> _r = _t->getServerInformation((*reinterpret_cast< std::add_pointer_t<QString&>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QString&>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString&>>(_a[3])));
            if (_a[0]) *reinterpret_cast< QDBusReply<QString>*>(_a[0]) = std::move(_r); }  break;
        case 6: { QDBusPendingReply<uint> _r = _t->notify((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<uint>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[4])),(*reinterpret_cast< std::add_pointer_t<QString>>(_a[5])),(*reinterpret_cast< std::add_pointer_t<QStringList>>(_a[6])),(*reinterpret_cast< std::add_pointer_t<QVariantMap>>(_a[7])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[8])));
            if (_a[0]) *reinterpret_cast< QDBusPendingReply<uint>*>(_a[0]) = std::move(_r); }  break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QXdgNotificationInterface::*)(uint , const QString & )>(_a, &QXdgNotificationInterface::ActionInvoked, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QXdgNotificationInterface::*)(uint , uint )>(_a, &QXdgNotificationInterface::NotificationClosed, 1))
            return;
    }
}